

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

void __thiscall
flow_cutter::DistanceAwareCutter::
init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>
          (DistanceAwareCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,DistanceType dist_type,
          SourceTargetPair p,int max_flow_intensity,int random_seed)

{
  BasicCutter::
  init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>
            (&this->cutter,graph,tmp,search_algo,p,max_flow_intensity);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->rng,(long)random_seed);
  if (dist_type == hop_distance) {
    compute_hop_distance_from<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
              (graph,tmp,p.source,this->node_dist);
    compute_hop_distance_from<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
              (graph,tmp,p.target,this->node_dist + 1);
    return;
  }
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo, DistanceType dist_type,
        SourceTargetPair p, int max_flow_intensity, int random_seed)
    {
        cutter.init(graph, tmp, search_algo, p, max_flow_intensity);

        rng.seed(random_seed);

        switch (dist_type) {
        case DistanceType::hop_distance:
            compute_hop_distance_from(graph, tmp, p.source, node_dist[source_side]);
            compute_hop_distance_from(graph, tmp, p.target, node_dist[target_side]);
            break;
        case DistanceType::no_distance:
            break;
        default:
            assert(false);
            break;
        }
    }